

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O3

int main(void)

{
  pointer pbVar1;
  pointer pcVar2;
  RamPutUserPolicyRequestType *this;
  HttpTestListener *pHVar3;
  undefined8 extraout_RAX;
  RamListUsersResponseType resp_5;
  RamAddUserRequestType req;
  RamGetUserRequestType req_2;
  RamAddUserResponseType resp;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined7 local_148;
  undefined1 uStack_141;
  undefined1 uStack_140;
  undefined1 uStack_13f;
  undefined1 uStack_13e;
  undefined1 local_13d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  
  pbVar1 = (pointer)(local_f8 + 0x10);
  local_f8._8_8_ = (pointer)0x0;
  local_f8[0x10] = '\0';
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  pcVar2 = local_98 + 0x10;
  local_98[0x10] = 'c';
  local_98._17_6_ = 0x676e61682d6e;
  local_98[0x17] = 'z';
  local_98[0x18] = 'h';
  local_98._25_2_ = 0x756f;
  local_98._8_8_ = 0xb;
  local_98[0x1b] = '\0';
  local_148 = 0x697070615f796d;
  uStack_141 = 100;
  local_158._8_8_ = 8;
  uStack_140 = 0;
  local_128._M_allocated_capacity._0_7_ = 0x726365735f796d;
  local_128._M_local_buf[7] = 'e';
  local_128._M_local_buf[8] = 't';
  local_138._8_8_ = 9;
  local_128._M_local_buf[9] = '\0';
  local_158._M_allocated_capacity = (size_type)&local_148;
  local_138._M_allocated_capacity = (size_type)&local_128;
  local_f8._0_8_ = pbVar1;
  local_d8._M_p = (pointer)&local_c8;
  local_98._0_8_ = pcVar2;
  this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient(local_98,&local_158,&local_138)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,
                    CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1);
  }
  if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
  }
  if ((pointer)local_98._0_8_ != pcVar2) {
    operator_delete((void *)local_98._0_8_,
                    CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
  }
  if (this == (RamPutUserPolicyRequestType *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if ((pointer)local_f8._0_8_ != pbVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_98[0x10] = 'c';
    local_98._17_6_ = 0x676e61682d6e;
    local_98[0x17] = 'z';
    local_98[0x18] = 'h';
    local_98._25_2_ = 0x756f;
    local_98._8_8_ = 0xb;
    local_98[0x1b] = '\0';
    local_148 = 0x697070615f796d;
    uStack_141 = 100;
    local_158._8_8_ = 8;
    uStack_140 = 0;
    local_128._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_128._M_local_buf[7] = 'e';
    local_128._M_local_buf[8] = 't';
    local_138._8_8_ = 9;
    local_128._M_local_buf[9] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_f8._0_8_ = pbVar1;
    local_d8._M_p = (pointer)&local_c8;
    local_98._0_8_ = pcVar2;
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    if (this != (RamPutUserPolicyRequestType *)0x0) goto LAB_0010519b;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if ((pointer)local_f8._0_8_ != pbVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_98._8_8_ = 0;
    local_98[0x10] = '\0';
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_148 = 0x676e61682d6e63;
    uStack_141 = 0x7a;
    uStack_140 = 0x68;
    uStack_13f = 0x6f;
    uStack_13e = 0x75;
    local_158._8_8_ = 0xb;
    local_13d = 0;
    local_128._M_allocated_capacity._0_7_ = 0x697070615f796d;
    local_128._M_local_buf[7] = 'd';
    local_138._8_8_ = 8;
    local_128._M_local_buf[8] = '\0';
    local_118.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_118.field_2._M_local_buf[7] = 'e';
    local_118.field_2._M_local_buf[8] = 't';
    local_118._M_string_length = 9;
    local_118.field_2._M_local_buf[9] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_f8._0_8_ = pbVar1;
    local_d8._M_p = (pointer)&local_c8;
    local_98._0_8_ = pcVar2;
    this = (RamPutUserPolicyRequestType *)
           aliyun::Ram::CreateRamClient(&local_158,&local_138,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if (this != (RamPutUserPolicyRequestType *)0x0) goto LAB_001052af;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if ((pointer)local_f8._0_8_ != pbVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    local_98._8_8_ = 0;
    local_98[0x10] = '\0';
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_f8._0_8_ = local_f8 + 0x10;
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_148 = 0x676e61682d6e63;
    uStack_141 = 0x7a;
    uStack_140 = 0x68;
    uStack_13f = 0x6f;
    uStack_13e = 0x75;
    local_158._8_8_ = 0xb;
    local_13d = 0;
    local_128._M_allocated_capacity._0_7_ = 0x697070615f796d;
    local_128._M_local_buf[7] = 'd';
    local_138._8_8_ = 8;
    local_128._M_local_buf[8] = '\0';
    local_118.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_118.field_2._M_local_buf[7] = 'e';
    local_118.field_2._M_local_buf[8] = 't';
    local_118._M_string_length = 9;
    local_118.field_2._M_local_buf[9] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_b8._M_p = (pointer)&local_a8;
    local_98._0_8_ = local_98 + 0x10;
    local_78._M_p = (pointer)&local_68;
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pcVar2 = local_98 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if (this != (RamPutUserPolicyRequestType *)0x0) goto LAB_001053c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    pbVar1 = (pointer)(local_f8 + 0x10);
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_58.field_2._M_allocated_capacity = 0;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_98[0x10] = 'c';
    local_98._17_6_ = 0x676e61682d6e;
    local_98[0x17] = 'z';
    local_98[0x18] = 'h';
    local_98._25_2_ = 0x756f;
    local_98._8_8_ = 0xb;
    local_98[0x1b] = '\0';
    local_148 = 0x697070615f796d;
    uStack_141 = 100;
    local_158._8_8_ = 8;
    uStack_140 = 0;
    local_128._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_128._M_local_buf[7] = 'e';
    local_128._M_local_buf[8] = 't';
    local_138._8_8_ = 9;
    local_128._M_local_buf[9] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_f8._0_8_ = pbVar1;
    local_98._0_8_ = pcVar2;
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    if (this != (RamPutUserPolicyRequestType *)0x0) goto LAB_001054ed;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    if ((pointer)local_f8._0_8_ != pbVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_178._16_2_ = 0;
    local_178[0x12] = '\0';
    local_178._19_4_ = 0;
    local_178[0x17] = '\0';
    local_f8[0x10] = 'c';
    local_f8._17_6_ = 0x676e61682d6e;
    local_f8._23_4_ = 0x756f687a;
    local_f8._8_8_ = (pointer)0xb;
    local_f8[0x1b] = '\0';
    local_98[0x10] = 'm';
    local_98._17_6_ = 0x697070615f79;
    local_98[0x17] = 'd';
    local_98._8_8_ = 8;
    local_98[0x18] = '\0';
    local_148 = 0x726365735f796d;
    uStack_141 = 0x65;
    uStack_140 = 0x74;
    local_158._8_8_ = 9;
    uStack_13f = 0;
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_f8._0_8_ = pbVar1;
    local_98._0_8_ = pcVar2;
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    if ((pointer)local_f8._0_8_ != pbVar1) {
      operator_delete((void *)local_f8._0_8_,
                      CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
    }
    if (this != (RamPutUserPolicyRequestType *)0x0) goto LAB_001055f0;
    std::vector<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>::
    ~vector((vector<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_> *)
            local_178);
    local_f8._8_8_ = (pointer)0x0;
    local_f8[0x10] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98[0x10] = 'c';
    local_98._17_6_ = 0x676e61682d6e;
    local_98[0x17] = 'z';
    local_98[0x18] = 'h';
    local_98._25_2_ = 0x756f;
    local_98._8_8_ = 0xb;
    local_98[0x1b] = '\0';
    local_148 = 0x697070615f796d;
    uStack_141 = 100;
    local_158._8_8_ = 8;
    uStack_140 = 0;
    local_128._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_128._M_local_buf[7] = 'e';
    local_128._M_local_buf[8] = 't';
    local_138._8_8_ = 9;
    local_128._M_local_buf[9] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_f8._0_8_ = pbVar1;
    local_b8._M_p = (pointer)&local_a8;
    local_98._0_8_ = pcVar2;
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
    }
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
    }
    if (this == (RamPutUserPolicyRequestType *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,
                        CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,
                        CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1)
        ;
      }
      if ((pointer)local_f8._0_8_ != pbVar1) {
        operator_delete((void *)local_f8._0_8_,
                        CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
      }
      local_f8._8_8_ = (pointer)0x0;
      local_f8[0x10] = '\0';
      local_98[0x10] = 'c';
      local_98._17_6_ = 0x676e61682d6e;
      local_98[0x17] = 'z';
      local_98[0x18] = 'h';
      local_98._25_2_ = 0x756f;
      local_98._8_8_ = 0xb;
      local_98[0x1b] = '\0';
      local_148 = 0x697070615f796d;
      uStack_141 = 100;
      local_158._8_8_ = 8;
      uStack_140 = 0;
      local_128._M_allocated_capacity._0_7_ = 0x726365735f796d;
      local_128._M_local_buf[7] = 'e';
      local_128._M_local_buf[8] = 't';
      local_138._8_8_ = 9;
      local_128._M_local_buf[9] = '\0';
      local_158._M_allocated_capacity = (size_type)&local_148;
      local_138._M_allocated_capacity = (size_type)&local_128;
      local_f8._0_8_ = pbVar1;
      local_98._0_8_ = pcVar2;
      this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,
                        CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) +
                        1);
      }
      if ((undefined7 *)local_158._M_allocated_capacity != &local_148) {
        operator_delete((void *)local_158._M_allocated_capacity,CONCAT17(uStack_141,local_148) + 1);
      }
      if ((pointer)local_98._0_8_ != pcVar2) {
        operator_delete((void *)local_98._0_8_,
                        CONCAT17(local_98[0x17],CONCAT61(local_98._17_6_,local_98[0x10])) + 1);
      }
      if (this == (RamPutUserPolicyRequestType *)0x0) {
        if ((pointer)local_f8._0_8_ != pbVar1) {
          operator_delete((void *)local_f8._0_8_,
                          CONCAT17(local_f8[0x17],CONCAT61(local_f8._17_6_,local_f8[0x10])) + 1);
        }
        return 0;
      }
      goto LAB_001057fe;
    }
  }
  else {
    local_118.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_118.field_2._M_local_buf[7] = '.';
    local_118.field_2._M_local_buf[8] = '1';
    local_118.field_2._M_local_buf[9] = ':';
    local_118.field_2._10_5_ = 0x3433323231;
    local_118._M_string_length = 0xf;
    local_118.field_2._M_local_buf[0xf] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    aliyun::Ram::SetProxyHost((Ram *)this,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_178._16_2_ = 0x7d7b;
    local_178._8_8_ = (pointer)0x2;
    local_178[0x12] = '\0';
    local_178._0_8_ = (pointer)(local_178 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,
                      CONCAT17(local_178[0x17],
                               CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    std::__cxx11::string::operator=((string *)&local_d8,"Comments");
    aliyun::Ram::AddUser
              ((RamAddUserRequestType *)this,(RamAddUserResponseType *)local_f8,
               (RamErrorInfo *)&local_58);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_1();
LAB_0010519b:
    local_118.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_118.field_2._M_local_buf[7] = '.';
    local_118.field_2._M_local_buf[8] = '1';
    local_118.field_2._M_local_buf[9] = ':';
    local_118.field_2._10_5_ = 0x3433323231;
    local_118._M_string_length = 0xf;
    local_118.field_2._M_local_buf[0xf] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    aliyun::Ram::SetProxyHost((Ram *)this,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_178._16_2_ = 0x7d7b;
    local_178._8_8_ = (pointer)0x2;
    local_178[0x12] = '\0';
    local_178._0_8_ = (pointer)(local_178 + 0x10);
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,
                      CONCAT17(local_178[0x17],
                               CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    std::__cxx11::string::operator=((string *)&local_d8,"PolicyName");
    aliyun::Ram::DeleteUserPolicy
              ((RamDeleteUserPolicyRequestType *)this,(RamDeleteUserPolicyResponseType *)local_f8,
               (RamErrorInfo *)&local_58);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_2();
LAB_001052af:
    local_178._16_2_ = 0x3231;
    local_178[0x12] = '7';
    local_178._19_4_ = 0x302e302e;
    local_178[0x17] = '.';
    local_178._24_7_ = 0x34333232313a31;
    local_178._8_8_ = (pointer)0xf;
    local_178[0x1f] = '\0';
    local_178._0_8_ = (pointer)(local_178 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,
                      CONCAT17(local_178[0x17],
                               CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_))
                              ) + 1);
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"{  \"UserName\": \"UserName\",  \"Comments\": \"Comments\"}","")
    ;
    HttpTestListener::SetResponseBody(pHVar3,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_98,"UserName");
    aliyun::Ram::GetUser
              ((RamGetUserRequestType *)this,(RamGetUserResponseType *)local_98,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_3();
LAB_001053c4:
    local_178._16_2_ = 0x3231;
    local_178[0x12] = '7';
    local_178._19_4_ = 0x302e302e;
    local_178[0x17] = '.';
    local_178._24_7_ = 0x34333232313a31;
    local_178._8_8_ = (pointer)0xf;
    local_178[0x1f] = '\0';
    local_178._0_8_ = (pointer)(local_178 + 0x10);
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,
                      CONCAT17(local_178[0x17],
                               CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_))
                              ) + 1);
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "{  \"UserName\": \"UserName\",  \"PolicyName\": \"PolicyName\",  \"PolicyDocument\": \"PolicyDocument\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_98,"UserName");
    std::__cxx11::string::operator=((string *)&local_78,"PolicyName");
    aliyun::Ram::GetUserPolicy
              ((RamGetUserPolicyRequestType *)this,(RamGetUserPolicyResponseType *)local_98,
               (RamErrorInfo *)local_f8);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_4();
LAB_001054ed:
    local_118.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_118.field_2._M_local_buf[7] = '.';
    local_118.field_2._M_local_buf[8] = '1';
    local_118.field_2._M_local_buf[9] = ':';
    local_118.field_2._10_5_ = 0x3433323231;
    local_118._M_string_length = 0xf;
    local_118.field_2._M_local_buf[0xf] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    aliyun::Ram::SetProxyHost((Ram *)this,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_178._0_8_ = (pointer)(local_178 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"{  \"Policies\": {    \"Policy\": [      \"Policy\"    ]  }}",""
              );
    HttpTestListener::SetResponseBody(pHVar3,(string *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,
                      CONCAT17(local_178[0x17],
                               CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar3);
    std::__cxx11::string::operator=((string *)local_f8,"UserName");
    aliyun::Ram::ListUserPolicies
              ((RamListUserPoliciesRequestType *)this,(RamListUserPoliciesResponseType *)local_f8,
               (RamErrorInfo *)&local_58);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_5();
LAB_001055f0:
    local_128._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_128._M_local_buf[7] = '.';
    local_128._M_local_buf[8] = '1';
    local_128._M_local_buf[9] = ':';
    local_128._10_5_ = 0x3433323231;
    local_138._8_8_ = 0xf;
    local_128._M_local_buf[0xf] = '\0';
    local_138._M_allocated_capacity = (size_type)&local_128;
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,
                      CONCAT17(local_128._M_local_buf[7],local_128._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    pHVar3 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar3,0x2fca);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "{  \"Users\": {    \"User\": [      {        \"UserName\": \"UserName\",        \"Comments\": \"Comments\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar3,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT17(local_118.field_2._M_local_buf[7],
                               local_118.field_2._M_allocated_capacity._0_7_) + 1);
    }
    HttpTestListener::Start(pHVar3);
    aliyun::Ram::ListUsers((RamListUsersResponseType *)this,(RamErrorInfo *)local_178);
    HttpTestListener::WaitComplete(pHVar3);
    main_cold_6();
  }
  local_118.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_118.field_2._M_local_buf[7] = '.';
  local_118.field_2._M_local_buf[8] = '1';
  local_118.field_2._M_local_buf[9] = ':';
  local_118.field_2._10_5_ = 0x3433323231;
  local_118._M_string_length = 0xf;
  local_118.field_2._M_local_buf[0xf] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  aliyun::Ram::SetProxyHost((Ram *)this,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT17(local_118.field_2._M_local_buf[7],
                             local_118.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->policy_name)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
  }
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  local_178._16_2_ = 0x7d7b;
  local_178._8_8_ = (pointer)0x2;
  local_178[0x12] = '\0';
  local_178._0_8_ = (pointer)(local_178 + 0x10);
  HttpTestListener::SetResponseBody(pHVar3,(string *)local_178);
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,
                    CONCAT17(local_178[0x17],
                             CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_)))
                    + 1);
  }
  HttpTestListener::Start(pHVar3);
  std::__cxx11::string::operator=((string *)local_f8,"UserName");
  std::__cxx11::string::operator=((string *)&local_d8,"PolicyName");
  std::__cxx11::string::operator=((string *)&local_b8,"PolicyDocument");
  aliyun::Ram::PutUserPolicy
            (this,(RamPutUserPolicyResponseType *)local_f8,(RamErrorInfo *)&local_58);
  HttpTestListener::WaitComplete(pHVar3);
  main_cold_7();
LAB_001057fe:
  local_118.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_118.field_2._M_local_buf[7] = '.';
  local_118.field_2._M_local_buf[8] = '1';
  local_118.field_2._M_local_buf[9] = ':';
  local_118.field_2._10_5_ = 0x3433323231;
  local_118._M_string_length = 0xf;
  local_118.field_2._M_local_buf[0xf] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  aliyun::Ram::SetProxyHost((Ram *)this,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT17(local_118.field_2._M_local_buf[7],
                             local_118.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->policy_name)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
  }
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  local_178._16_2_ = 0x7d7b;
  local_178._8_8_ = (pointer)0x2;
  local_178[0x12] = '\0';
  local_178._0_8_ = (pointer)(local_178 + 0x10);
  HttpTestListener::SetResponseBody(pHVar3,(string *)local_178);
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,
                    CONCAT17(local_178[0x17],
                             CONCAT43(local_178._19_4_,CONCAT12(local_178[0x12],local_178._16_2_)))
                    + 1);
  }
  HttpTestListener::Start(pHVar3);
  std::__cxx11::string::operator=((string *)local_f8,"UserName");
  aliyun::Ram::RemoveUser
            ((RamRemoveUserRequestType *)this,(RamRemoveUserResponseType *)local_f8,
             (RamErrorInfo *)&local_58);
  HttpTestListener::WaitComplete(pHVar3);
  main_cold_8();
  aliyun::RamPutUserPolicyRequestType::~RamPutUserPolicyRequestType
            ((RamPutUserPolicyRequestType *)local_f8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_user();
  test_delete_user_policy();
  test_get_user();
  test_get_user_policy();
  test_list_user_policies();
  test_list_users();
  test_put_user_policy();
  test_remove_user();
}